

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_custom_4d(ggml_context *ctx,ggml_type type,int64_t ne0,int64_t ne1,int64_t ne2,int64_t ne3,
              ggml_tensor **args,int n_args,ggml_custom_op_t fun,int n_tasks,void *userdata)

{
  ggml_tensor *tensor;
  ulong uVar1;
  ulong uVar2;
  ggml_custom_op_params params;
  
  if (n_args < 10) {
    tensor = ggml_new_tensor_4d(ctx,type,ne0,ne1,ne2,ne3);
    params.fun = fun;
    params.n_tasks = n_tasks;
    params.userdata = userdata;
    ggml_set_op_params(tensor,&params,0x18);
    tensor->op = GGML_OP_CUSTOM;
    uVar1 = 0;
    uVar2 = (ulong)(uint)n_args;
    if (n_args < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      tensor->src[uVar1] = args[uVar1];
    }
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x13b6,
             "GGML_ASSERT(%s) failed","n_args < GGML_MAX_SRC");
}

Assistant:

struct ggml_tensor * ggml_custom_4d(
        struct ggml_context * ctx,
        enum ggml_type        type,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2,
        int64_t               ne3,
        struct ggml_tensor ** args,
        int                   n_args,
        ggml_custom_op_t      fun,
        int                   n_tasks,
        void                * userdata) {

    GGML_ASSERT(n_args < GGML_MAX_SRC);

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, type, ne0, ne1, ne2, ne3);

    struct ggml_custom_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op = GGML_OP_CUSTOM;
    for (int i = 0; i < n_args; i++) {
        result->src[i] = args[i];
    }

    return result;
}